

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<char>::resizeImpl<slang::SmallVectorBase<char>::DefaultInitTag>
          (SmallVectorBase<char> *this,size_type newSize,DefaultInitTag *val)

{
  DefaultInitTag temp;
  DefaultInitTag local_1;
  
  if (this->len <= newSize) {
    if (newSize <= this->len) {
      return;
    }
    if (this->cap < newSize) {
      resizeRealloc<slang::SmallVectorBase<char>::DefaultInitTag>(this,newSize,&local_1);
      return;
    }
  }
  this->len = newSize;
  return;
}

Assistant:

void resizeImpl(size_type newSize, const TVal& val) {
        if (newSize < len) {
            std::ranges::destroy(begin() + newSize, end());
            len = newSize;
            return;
        }

        if (newSize > len) {
            if (newSize > cap) {
                // Copy the value in case it's inside our existing array.
                TVal temp(val);
                resizeRealloc(newSize, temp);
                return;
            }

            if constexpr (std::is_same_v<T, TVal>) {
                std::ranges::uninitialized_fill_n(end(), ptrdiff_t(newSize - len), val);
            }
            else if constexpr (std::is_same_v<TVal, DefaultInitTag>) {
                std::ranges::uninitialized_default_construct_n(end(), ptrdiff_t(newSize - len));
            }
            else {
                std::ranges::uninitialized_value_construct_n(end(), ptrdiff_t(newSize - len));
            }
            len = newSize;
        }
    }